

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O3

void deqp::egl::anon_unknown_4::renderReference
               (PixelBufferAccess *dst,
               vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
               *drawOps,PixelFormat *colorBits,int depthBits,int stencilBits,int numSamples)

{
  IVec3 *pIVar1;
  int height;
  int depth;
  BlendMode BVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  pointer pDVar8;
  Renderer referenceRenderer;
  TextureLevel colorBuffer;
  TextureLevel stencilBuffer;
  TextureLevel depthBuffer;
  ReferenceShader shader;
  RenderTarget renderTarget;
  Renderer local_451;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  *local_450;
  PixelBufferAccess *local_448;
  DrawCommand local_440;
  TextureLevel local_410;
  TextureLevel local_3e8;
  TextureLevel local_3c0;
  VertexShader local_398;
  FragmentShader local_360;
  RenderState local_328;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_220 [16];
  GeometryShader *local_210;
  VertexAttrib local_1f8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  pointer pVStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  PixelBufferAccess local_1a0;
  PixelBufferAccess local_178;
  MultisamplePixelBufferAccess local_150;
  RenderTarget local_128;
  
  pIVar1 = &(dst->super_ConstPixelBufferAccess).m_size;
  height = pIVar1->m_data[0];
  depth = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  uVar5._0_4_ = pIVar1->m_data[0];
  uVar5._4_4_ = pIVar1->m_data[1];
  uVar4._0_4_ = pIVar1->m_data[0];
  uVar4._4_4_ = pIVar1->m_data[1];
  uVar3._0_4_ = pIVar1->m_data[0];
  uVar3._4_4_ = pIVar1->m_data[1];
  local_450 = drawOps;
  local_448 = dst;
  tcu::TextureLevel::TextureLevel(&local_410);
  tcu::TextureLevel::TextureLevel(&local_3c0);
  tcu::TextureLevel::TextureLevel(&local_3e8);
  rr::Renderer::Renderer(&local_451);
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = 0;
  pVStack_1c0 = (pointer)0x0;
  local_1f8.generic.v._8_8_ = 0;
  uStack_1d0 = 0;
  local_1f8.pointer = (pointer)0x0;
  local_1f8.generic.v._0_8_ = 0;
  rr::VertexShader::VertexShader(&local_398,2,1);
  rr::FragmentShader::FragmentShader(&local_360,1,1);
  local_128._0_8_ = 0x300000000;
  local_398._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_021155e0;
  local_360._vptr_FragmentShader = (_func_int **)&DAT_02115600;
  *(undefined8 *)
   local_398.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start = 0;
  (local_398.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_398.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->flatshade = false;
  (local_360.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_360.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->flatshade = false;
  (local_360.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_1f8.type = VERTEXATTRIBTYPE_FLOAT;
  local_1f8.size = 4;
  local_1f8.stride = 0;
  local_1f8.instanceDivisor = 0;
  uStack_1d0 = 0x400000000;
  local_1c8 = 0;
  uVar7 = colorBits->blueBits << 8 | colorBits->greenBits << 0x10 | colorBits->redBits << 0x18 |
          colorBits->alphaBits;
  uVar6 = 8;
  if ((int)uVar7 < 0x5060500) {
    if (uVar7 == 0x4040404) {
      local_128._0_8_ = 0xa00000000;
    }
    else if (uVar7 == 0x5050501) {
      local_128._0_8_ = 0xb00000000;
    }
  }
  else if (uVar7 == 0x5060500) {
    uVar6 = 7;
    local_128._0_8_ = 0x800000000;
  }
  else if (uVar7 == 0x8080800) {
    uVar6 = 7;
  }
  local_128._0_8_ = local_128._0_8_ | uVar6;
  tcu::TextureLevel::setStorage(&local_410,(TextureFormat *)&local_128,1,height,depth);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_128,&local_410);
  local_328.cullMode = CULLMODE_NONE;
  local_328.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
  local_328.rasterization._0_8_ = uVar3;
  rr::clearMultisampleColorBuffer
            ((PixelBufferAccess *)&local_128,(Vec4 *)CLEAR_COLOR,(WindowRectangle *)&local_328);
  if (0 < depthBits) {
    uVar7 = depthBits << 0x1d | (uint)depthBits >> 3;
    if (uVar7 < 4) {
      local_128._0_8_ =
           *(ulong *)(&DAT_01ba40b0 + (ulong)uVar7 * 8) |
           *(ulong *)(&DAT_01ba4090 + (ulong)uVar7 * 8);
    }
    else {
      local_128._0_8_ = 0x2300000012;
    }
    tcu::TextureLevel::setStorage(&local_3c0,(TextureFormat *)&local_128,1,height,depth);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_128,&local_3c0);
    local_328.cullMode = CULLMODE_NONE;
    local_328.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
    local_328.rasterization._0_8_ = uVar4;
    rr::clearMultisampleDepthBuffer
              ((PixelBufferAccess *)&local_128,1.0,(WindowRectangle *)&local_328);
  }
  if (0 < stencilBits) {
    local_128._0_8_ = 0x1e00000013;
    tcu::TextureLevel::setStorage(&local_3e8,(TextureFormat *)&local_128,1,height,depth);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_128,&local_3e8);
    local_328.cullMode = CULLMODE_NONE;
    local_328.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
    local_328.rasterization._0_8_ = uVar5;
    rr::clearMultisampleStencilBuffer
              ((PixelBufferAccess *)&local_128,0,(WindowRectangle *)&local_328);
  }
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_440,&local_410);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&local_440);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_220,&local_3c0);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_220);
  tcu::TextureLevel::getAccess(&local_178,&local_3e8);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_178);
  rr::RenderTarget::RenderTarget
            (&local_128,(MultisamplePixelBufferAccess *)&local_328,
             (MultisamplePixelBufferAccess *)&local_1a0,&local_150);
  pDVar8 = (local_450->
           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pDVar8 != (local_450->
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_220,&local_410);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_220);
      rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                ((MultisampleConstPixelBufferAccess *)&local_440,
                 (MultisamplePixelBufferAccess *)&local_1a0);
      local_238 = CONCAT44(local_440.program._0_4_,local_440.renderTarget._4_4_);
      uStack_230 = 0;
      local_328.cullMode = CULLMODE_NONE;
      local_328.provokingVertexConvention = PROVOKINGVERTEX_LAST;
      local_328.rasterization.winding = WINDING_CCW;
      local_328.rasterization.horizontalFill = FILL_LEFT;
      local_328.rasterization.verticalFill = FILL_BOTTOM;
      local_328.rasterization.viewportOrientation = VIEWPORTORIENTATION_LAST;
      rr::FragmentOperationState::FragmentOperationState(&local_328.fragOps);
      local_328.point.pointSize = 1.0;
      local_328.viewport.rect.left = 0;
      local_328.viewport.rect.bottom = 0;
      local_328.viewport.rect.width = (int)local_238;
      local_328.viewport.rect.height = local_238._4_4_;
      local_328.viewport.zn = 0.0;
      local_328.viewport.zf = 1.0;
      local_328.line.lineWidth = 1.0;
      local_328.restart.enabled = false;
      local_328.restart.restartIndex = 0xffffffff;
      local_328.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
      local_328.rasterization._8_8_ = local_328.rasterization._8_8_ & 0xffffffff;
      local_328._0_8_ = local_328._0_8_ & 0xffffffff00000000;
      BVar2 = pDVar8->blend;
      if (BVar2 != BLENDMODE_NONE) {
        local_328.fragOps.blendMode = BLENDMODE_STANDARD;
        if (BVar2 == BLENDMODE_ADDITIVE) {
          local_328.fragOps.blendRGBState.srcFunc = BLENDFUNC_ONE;
          local_328.fragOps.blendRGBState.dstFunc = BLENDFUNC_ONE;
        }
        else {
          if (BVar2 != BLENDMODE_SRC_OVER) goto LAB_00e6fbc7;
          local_328.fragOps.blendRGBState.dstFunc = BLENDFUNC_ONE_MINUS_SRC_ALPHA;
          local_328.fragOps.blendRGBState.srcFunc = BLENDFUNC_SRC_ALPHA;
        }
        local_328.fragOps.blendRGBState.equation = BLENDEQUATION_ADD;
        local_328.fragOps.blendAState._0_8_ = (ulong)local_328.fragOps.blendRGBState.srcFunc << 0x20
        ;
        local_328.fragOps.blendAState.dstFunc = local_328.fragOps.blendRGBState.dstFunc;
      }
LAB_00e6fbc7:
      if (pDVar8->depth != DEPTHMODE_NONE) {
        local_328.fragOps.depthTestEnabled = true;
        local_328.fragOps.depthFunc = TESTFUNC_LESS;
      }
      if (pDVar8->stencil != STENCILMODE_NONE) {
        local_328.fragOps.stencilTestEnabled = true;
        local_328.fragOps.stencilStates[0].func = TESTFUNC_LEQUAL;
        local_328.fragOps.stencilStates[0].sFail = STENCILOP_KEEP;
        local_328.fragOps.stencilStates[0].dpFail = STENCILOP_INCR;
        local_328.fragOps.stencilStates[0].dpPass = STENCILOP_INCR;
        local_328.fragOps.stencilStates[0].ref = pDVar8->stencilRef;
        local_328.fragOps.stencilStates[1].ref = local_328.fragOps.stencilStates[0].ref;
        local_328.fragOps.stencilStates[1].func = TESTFUNC_LEQUAL;
        local_328.fragOps.stencilStates[1].writeMask = local_328.fragOps.stencilStates[0].writeMask;
        local_328.fragOps.stencilStates[1].dpPass = STENCILOP_INCR;
        local_328.fragOps.stencilStates[1].dpFail = STENCILOP_INCR;
        local_328.fragOps.stencilStates[1].sFail = STENCILOP_KEEP;
      }
      local_1f8.pointer =
           (pDVar8->positions).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pVStack_1c0 = (pDVar8->colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_220._0_8_ = &local_398;
      local_220._8_8_ = &local_360;
      local_210 = (GeometryShader *)0x0;
      rr::PrimitiveList::PrimitiveList
                ((PrimitiveList *)&local_1a0,PRIMITIVETYPE_TRIANGLES,pDVar8->count * 3,0);
      local_440.state = &local_328;
      local_440.renderTarget = &local_128;
      local_440.numVertexAttribs = 2;
      local_440.vertexAttribs = &local_1f8;
      local_440.primitives = (PrimitiveList *)&local_1a0;
      local_440.program = (Program *)local_220;
      rr::Renderer::draw(&local_451,&local_440);
      pDVar8 = pDVar8 + 1;
    } while (pDVar8 != (local_450->
                       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  tcu::TextureLevel::getAccess(&local_1a0,&local_410);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_1a0);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_328,
             (MultisamplePixelBufferAccess *)&local_440);
  rr::resolveMultisampleColorBuffer(local_448,(MultisampleConstPixelBufferAccess *)&local_328);
  rr::FragmentShader::~FragmentShader(&local_360);
  rr::VertexShader::~VertexShader(&local_398);
  rr::Renderer::~Renderer(&local_451);
  tcu::TextureLevel::~TextureLevel(&local_3e8);
  tcu::TextureLevel::~TextureLevel(&local_3c0);
  tcu::TextureLevel::~TextureLevel(&local_410);
  return;
}

Assistant:

void renderReference (const tcu::PixelBufferAccess& dst, const vector<DrawPrimitiveOp>& drawOps, const tcu::PixelFormat& colorBits, const int depthBits, const int stencilBits, const int numSamples)
{
	const int						width			= dst.getWidth();
	const int						height			= dst.getHeight();

	tcu::TextureLevel				colorBuffer;
	tcu::TextureLevel				depthBuffer;
	tcu::TextureLevel				stencilBuffer;

	rr::Renderer					referenceRenderer;
	rr::VertexAttrib				attributes[2];
	const ReferenceShader			shader;

	attributes[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attributes[0].size				= 4;
	attributes[0].stride			= 0;
	attributes[0].instanceDivisor	= 0;

	attributes[1].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attributes[1].size				= 4;
	attributes[1].stride			= 0;
	attributes[1].instanceDivisor	= 0;

	// Initialize buffers.
	colorBuffer.setStorage(getColorFormat(colorBits), numSamples, width, height);
	rr::clearMultisampleColorBuffer(colorBuffer, CLEAR_COLOR, rr::WindowRectangle(0, 0, width, height));

	if (depthBits > 0)
	{
		depthBuffer.setStorage(getDepthFormat(depthBits), numSamples, width, height);
		rr::clearMultisampleDepthBuffer(depthBuffer, CLEAR_DEPTH, rr::WindowRectangle(0, 0, width, height));
	}

	if (stencilBits > 0)
	{
		stencilBuffer.setStorage(getStencilFormat(stencilBits), numSamples, width, height);
		rr::clearMultisampleStencilBuffer(stencilBuffer, CLEAR_STENCIL, rr::WindowRectangle(0, 0, width, height));
	}

	const rr::RenderTarget renderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess()),
										rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer.getAccess()),
										rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer.getAccess()));

	for (vector<DrawPrimitiveOp>::const_iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); drawOp++)
	{
		// Translate state
		rr::RenderState renderState((rr::ViewportState)(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess())));
		toReferenceRenderState(renderState, *drawOp);

		DE_ASSERT(drawOp->type == PRIMITIVETYPE_TRIANGLE);

		attributes[0].pointer = &drawOp->positions[0];
		attributes[1].pointer = &drawOp->colors[0];

		referenceRenderer.draw(
			rr::DrawCommand(
				renderState,
				renderTarget,
				rr::Program(static_cast<const rr::VertexShader*>(&shader), static_cast<const rr::FragmentShader*>(&shader)),
				2,
				attributes,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, drawOp->count * 3, 0)));
	}

	rr::resolveMultisampleColorBuffer(dst, rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer.getAccess()));
}